

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O1

value_type_conflict2 __thiscall
protozero::const_varint_iterator<unsigned_long>::operator*
          (const_varint_iterator<unsigned_long> *this)

{
  uint64_t val;
  value_type_conflict2 vVar1;
  assert_error *this_00;
  char *d;
  char *local_18;
  
  local_18 = this->m_data;
  if (local_18 == (char *)0x0) {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
    __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_18 == this->m_end) || (vVar1 = (value_type_conflict2)*local_18, (long)vVar1 < 0)) {
    vVar1 = detail::decode_varint_impl(&local_18,this->m_end);
  }
  return vVar1;
}

Assistant:

value_type operator*() const {
        protozero_assert(m_data);
        const char* d = m_data; // will be thrown away
        return static_cast<value_type>(decode_varint(&d, m_end));
    }